

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
SparseHashMapMoveTest_Emplace_KeyMoveCount_Test::SparseHashMapMoveTest_Emplace_KeyMoveCount_Test
          (SparseHashMapMoveTest_Emplace_KeyMoveCount_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__SparseHashMapMoveTest_Emplace_KeyMoveCount_Test_01323cf0;
  return;
}

Assistant:

TEST(SparseHashMapMoveTest, Emplace_KeyMoveCount)
{
    sparse_hash_map<A, int, HashA> h;
    A::reset();
    h.emplace(1, 2);

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}